

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_conn.c
# Opt level: O0

void forwarder_tcp(worker_handle *wh)

{
  proxy_conn_handle *pc_00;
  undefined8 *puVar1;
  proxy_handle *ppVar2;
  char *pcVar3;
  uint local_1034;
  int ret;
  proxy_msg *msg;
  uint8_t buf [4096];
  proxy_conn_priv *priv;
  proxy_conn_handle *pc;
  worker_handle *wh_local;
  
  pc_00 = (proxy_conn_handle *)wh->func_ctx;
  puVar1 = (undefined8 *)pc_00->priv;
  memset(&msg,0,0x1000);
  msg._0_1_ = 2;
  proxy_log(pc_00->ph,LOG_LEVEL_DEBUG,"TCP forwarding thread is starting for client \'%s\'\n",
            puVar1 + 0x21b);
  do {
    local_1034 = conn_recv_any((conn_handle *)(puVar1 + 9),buf + 1,0xff7,(uint32_t *)0x0,
                               (uint16_t *)0x0);
    if ((int)local_1034 < 1) {
      if (local_1034 == 0) {
        local_1034 = 0xffffffe0;
      }
    }
    else {
      unique0x10000257 = local_1034;
      proxy_log(pc_00->ph,LOG_LEVEL_DEBUG,"Sending TCP_DATA message to client \'%s\' (%d bytes)\n",
                puVar1 + 0x21b,(ulong)local_1034);
      mutex_lock((mutex_handle *)(puVar1 + 0xe));
      local_1034 = conn_send((conn_handle *)*puVar1,(uint8_t *)&msg,
                             (ulong)stack0xffffffffffffefdd + 9);
      mutex_unlock((mutex_handle *)(puVar1 + 0xe));
      if ((int)local_1034 < 0) {
        conn_close((conn_handle *)(puVar1 + 9));
        ppVar2 = pc_00->ph;
        pcVar3 = strerror(-local_1034);
        proxy_log(ppVar2,LOG_LEVEL_DEBUG,
                  "Client \'%s\' TCP thread is returning due to a client connection error (%d): %s\n"
                  ,puVar1 + 0x21b,(ulong)-local_1034,pcVar3);
        if (local_1034 == 0xffffff95) {
          return;
        }
        if (local_1034 == 0xffffff98) {
          return;
        }
        if (local_1034 == 0xffffffe0) {
          return;
        }
        if (local_1034 == 0xfffffffc) {
          return;
        }
        proxy_conn_drop(pc_00);
        return;
      }
    }
    if ((int)local_1034 < 0) {
      if ((((local_1034 != 0xffffff95) && (local_1034 != 0xffffff98)) && (local_1034 != 0xffffffe0))
         && (local_1034 != 0xfffffffc)) {
        ppVar2 = pc_00->ph;
        pcVar3 = strerror(-local_1034);
        proxy_log(ppVar2,LOG_LEVEL_WARN,
                  "Failed to receive data on client \'%s\' TCP connection (%d): %s\n",puVar1 + 0x21b
                  ,(ulong)-local_1034,pcVar3);
      }
      conn_close((conn_handle *)(puVar1 + 9));
      send_tcp_close(pc_00);
      proxy_log(pc_00->ph,LOG_LEVEL_DEBUG,"Client \'%s\' TCP worker is returning cleanly\n",
                puVar1 + 0x21b);
      return;
    }
  } while( true );
}

Assistant:

static void forwarder_tcp(struct worker_handle *wh)
{
	struct proxy_conn_handle *pc = wh->func_ctx;
	struct proxy_conn_priv *priv = pc->priv;

	uint8_t buf[CONN_BUFF_LEN] = { 0 };
	struct proxy_msg *msg = (struct proxy_msg *)buf;
	int ret;

	msg->type = PROXY_MSG_TYPE_TCP_DATA;

	proxy_log(pc->ph, LOG_LEVEL_DEBUG,
		  "TCP forwarding thread is starting for client '%s'\n",
		  priv->callsign);

	do {
		ret = conn_recv_any(&priv->conn_tcp, buf + sizeof(*msg),
				    CONN_BUFF_LEN_HEADERLESS, NULL, NULL);
		if (ret > 0) {
			msg->size = ret;

			proxy_log(pc->ph, LOG_LEVEL_DEBUG,
				  "Sending TCP_DATA message to client '%s' (%d bytes)\n",
				  priv->callsign, msg->size);

			mutex_lock(&priv->mutex_client_send);

			ret = conn_send(priv->conn_client, (uint8_t *)msg,
					sizeof(*msg) + msg->size);

			mutex_unlock(&priv->mutex_client_send);

			/* This is an error with the client connection */
			if (ret < 0) {
				conn_close(&priv->conn_tcp);

				proxy_log(pc->ph, LOG_LEVEL_DEBUG,
					  "Client '%s' TCP thread is returning due to a client connection error (%d): %s\n",
					  priv->callsign, -ret, strerror(-ret));

				switch (ret) {
				case -ECONNRESET:
				case -EINTR:
				case -ENOTCONN:
				case -EPIPE:
					break;
				default:
					proxy_conn_drop(pc);
					break;
				}

				return;
			}
		} else if (ret == 0) {
			ret = -EPIPE;
		}
	} while (ret >= 0);

	switch (ret) {
	case -ECONNRESET:
	case -EINTR:
	case -ENOTCONN:
	case -EPIPE:
		break;
	default:
		proxy_log(pc->ph, LOG_LEVEL_WARN,
			  "Failed to receive data on client '%s' TCP connection (%d): %s\n",
			  priv->callsign, -ret, strerror(-ret));
		break;
	}

	conn_close(&priv->conn_tcp);

	send_tcp_close(pc);

	proxy_log(pc->ph, LOG_LEVEL_DEBUG,
		  "Client '%s' TCP worker is returning cleanly\n",
		  priv->callsign);
}